

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckRules.cpp
# Opt level: O2

void __thiscall GdlRuleItem::AssignFsmInternalID(GdlRuleItem *this,GrcManager *pcman,int nPassID)

{
  GrcSymbolTableEntry *this_00;
  GdlGlyphClassDefn *pglfc;
  
  this_00 = this->m_psymInput;
  if ((this_00 != (GrcSymbolTableEntry *)0x0) && (this_00->m_pData != (GdlDefn *)0x0)) {
    pglfc = GrcSymbolTableEntry::GlyphClassDefnData(this_00);
    GrcManager::AddToFsmClasses(pcman,pglfc,nPassID);
    return;
  }
  return;
}

Assistant:

void GdlRuleItem::AssignFsmInternalID(GrcManager * pcman, int nPassID)
{
	if (!m_psymInput)
		//	Already recorded an error--undefined class.
		return;

	if (m_psymInput->Data())
	{
		GdlGlyphClassDefn * pglfcIn = m_psymInput->GlyphClassDefnData();
		Assert(pglfcIn);
		pcman->AddToFsmClasses(pglfcIn, nPassID);
	}
	//	else insertion
}